

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EmitPropDelete
          (ByteCodeGenerator *this,RegSlot lhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo)

{
  ByteCodeWriter *this_00;
  Scope *symScope;
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  PropertyId PVar4;
  uint uVar5;
  ByteCodeLabel labelID;
  RegSlot value;
  Scope **ppSVar6;
  undefined4 *puVar7;
  Scope *scope;
  Type *pTVar8;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 instance;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 aVar9;
  int i;
  int index;
  undefined1 local_a8 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  PropertyId local_60;
  DynamicLoadKind local_5c;
  PropertyId envIndex;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 local_54;
  ByteCodeGenerator *local_50;
  undefined4 *local_48;
  FuncInfo *local_40;
  RegSlot local_34;
  
  local_60 = -1;
  recList._40_8_ = &this->globalScope;
  ppSVar6 = &sym->scope;
  if (sym == (Symbol *)0x0) {
    ppSVar6 = (Scope **)recList._40_8_;
  }
  symScope = *ppSVar6;
  local_50 = this;
  local_40 = funcInfo;
  local_34 = lhsLocation;
  if (symScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x14d1,"(symScope)","symScope");
    if (!bVar2) {
LAB_00765cc4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
    local_48 = puVar7;
  }
  else {
    local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       local_50->alloc;
  local_a8 = (undefined1  [8])&PTR_IsReadOnly_0137a130;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  this_00 = &local_50->m_writer;
  instance.index = 0xffffffff;
  scope = (Scope *)0x0;
  do {
    scope = FindScopeForSym(local_50,symScope,scope,&local_60,local_40);
    aVar9.index = 0xfffffffd;
    if ((scope != *(Scope **)recList._40_8_) && (aVar9 = instance, local_60 == -1)) {
      if (scope->func != local_40) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_48 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x14de,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()");
        if (!bVar2) goto LAB_00765cc4;
        *local_48 = 0;
      }
      aVar9.instance = scope->location;
    }
    instance = aVar9;
    if (scope == symScope) {
      if (sym == (Symbol *)0x0) {
        PVar4 = pid->m_propertyId;
LAB_00765a3d:
        if ((local_50->flags & 0x404) == 0) {
          uVar5 = FuncInfo::FindOrAddReferencedPropertyId(local_40,PVar4);
          Js::ByteCodeWriter::Property(this_00,DeleteRootFld,local_34,0xfffffffd,uVar5,false);
        }
        else {
          uVar5 = FuncInfo::FindOrAddReferencedPropertyId(local_40,PVar4);
          Js::ByteCodeWriter::ScopedProperty
                    (this_00,ScopedDeleteFld,local_34,uVar5,
                     local_50->forceStrictModeForClassComputedPropertyName);
        }
      }
      else {
        if ((sym->field_0x42 & 8) != 0) {
          PVar4 = Symbol::EnsurePosition(sym,local_50);
          goto LAB_00765a3d;
        }
        Symbol::EnsureScopeSlot(sym,local_50,local_40);
        Js::ByteCodeWriter::Reg1(this_00,LdFalse,local_34);
      }
      if ((int)recList.
               super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer
          == 0) goto LAB_00765ca9;
      labelID = Js::ByteCodeWriter::DefineLabel(this_00);
      Js::ByteCodeWriter::Br(this_00,labelID);
      index = 0;
      break;
    }
    if ((scope == (Scope *)0x0) || (uVar3 = *(ushort *)&scope->field_0x44, (uVar3 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_48 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x14e8,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar2) goto LAB_00765cc4;
      *local_48 = 0;
      uVar3 = *(ushort *)&scope->field_0x44;
    }
    if ((uVar3 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_48 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x14e9,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar2) goto LAB_00765cc4;
      *local_48 = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)&stack0xffffffffffffffa4);
    envIndex = Js::ByteCodeWriter::DefineLabel(this_00);
    if (sym == (Symbol *)0x0) {
      PVar4 = pid->m_propertyId;
    }
    else {
      PVar4 = Symbol::EnsurePosition(sym,local_50);
    }
    uVar5 = FuncInfo::FindOrAddReferencedPropertyId(local_40,PVar4);
    if (scope->scopeType == ScopeType_With) {
      if (local_60 == -1) {
        Js::ByteCodeWriter::BrProperty(this_00,BrOnHasProperty,envIndex,instance.instance,uVar5);
        local_5c = LocalWith;
        local_54 = instance;
      }
      else {
        aVar9.index = local_60 + 1;
        Js::ByteCodeWriter::BrEnvProperty(this_00,BrOnHasEnvProperty,envIndex,uVar5,aVar9.index);
        local_5c = EnvWith;
        local_54.index = aVar9.index;
      }
    }
    else if (local_60 == -1) {
      Js::ByteCodeWriter::BrLocalProperty(this_00,BrOnHasLocalProperty,envIndex,uVar5);
      local_5c = Local;
      local_54 = instance;
    }
    else {
      aVar9.index = local_60 + 1;
      Js::ByteCodeWriter::BrEnvProperty(this_00,BrOnHasLocalEnvProperty,envIndex,uVar5,aVar9.index);
      local_5c = Env;
      local_54.index = aVar9.index;
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Add((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)local_a8,(DynamicLoadRecord *)&stack0xffffffffffffffa4);
  } while( true );
LAB_00765aba:
  if (sym == (Symbol *)0x0) {
    PVar4 = pid->m_propertyId;
  }
  else {
    PVar4 = Symbol::EnsurePosition(sym,local_50);
  }
  uVar5 = FuncInfo::FindOrAddReferencedPropertyId(local_40,PVar4);
  pTVar8 = JsUtil::
           List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)local_a8,index);
  Js::ByteCodeWriter::MarkLabel(this_00,pTVar8->label);
  pTVar8 = JsUtil::
           List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)local_a8,index);
  switch(pTVar8->kind) {
  case Local:
    Js::ByteCodeWriter::ElementU(this_00,DeleteLocalFld_ReuseLoc,local_34,uVar5);
    goto LAB_00765c80;
  case Env:
    value = FuncInfo::AcquireTmpRegister(local_40);
    pTVar8 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_a8,index);
    Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,value,(pTVar8->field_2).index);
    Js::ByteCodeWriter::Property(this_00,DeleteFld_ReuseLoc,local_34,value,uVar5,false);
    break;
  case LocalWith:
    value = FuncInfo::AcquireTmpRegister(local_40);
    pTVar8 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_a8,index);
    Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,value,(pTVar8->field_2).instance);
    Js::ByteCodeWriter::Property(this_00,DeleteFld_ReuseLoc,local_34,value,uVar5,false);
    break;
  case EnvWith:
    value = FuncInfo::AcquireTmpRegister(local_40);
    pTVar8 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_a8,index);
    Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,value,(pTVar8->field_2).index);
    Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,value,value);
    Js::ByteCodeWriter::Property(this_00,DeleteFld_ReuseLoc,local_34,value,uVar5,false);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_48 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1554,"((0))","(0)");
    if (bVar2) {
      *local_48 = 0;
      goto LAB_00765c80;
    }
    goto LAB_00765cc4;
  }
  FuncInfo::ReleaseTmpRegister(local_40,value);
LAB_00765c80:
  if (index == (int)recList.
                    super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                    buffer + -1) {
    Js::ByteCodeWriter::MarkLabel(this_00,labelID);
LAB_00765ca9:
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    ~List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)local_a8);
    return;
  }
  Js::ByteCodeWriter::Br(this_00,labelID);
  index = index + 1;
  goto LAB_00765aba;
}

Assistant:

void ByteCodeGenerator::EmitPropDelete(Js::RegSlot lhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo)
{
    // If sym belongs to a parent frame, delete it from the closure environment.
    // If it belongs to this func, but there's a non-local reference, get it from the heap-allocated frame.
    // (TODO: optimize this by getting the sym from its normal location if there are no non-local defs.)
    // Otherwise, just return false.

    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            scopeLocation = ByteCodeGenerator::RootObjectRegister;
        }
        else if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        if (this->flags & (fscrEval | fscrImplicitThis))
        {
            this->m_writer.ScopedProperty(Js::OpCode::ScopedDeleteFld, lhsLocation,
                funcInfo->FindOrAddReferencedPropertyId(propertyId), forceStrictModeForClassComputedPropertyName);
        }
        else
        {
            this->m_writer.Property(Js::OpCode::DeleteRootFld, lhsLocation, ByteCodeGenerator::RootObjectRegister,
                funcInfo->FindOrAddReferencedPropertyId(propertyId));
        }
    }
    else
    {
        // The delete will look like a non-local reference, so make sure a slot is reserved.
        sym->EnsureScopeSlot(this, funcInfo);
        this->m_writer.Reg1(Js::OpCode::LdFalse, lhsLocation);
    }

    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
            Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    this->m_writer.ElementU(Js::OpCode::DeleteLocalFld_ReuseLoc, lhsLocation, propertyIndex);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Property(Js::OpCode::DeleteFld_ReuseLoc, lhsLocation, instLocation, propertyIndex);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    this->m_writer.Property(Js::OpCode::DeleteFld_ReuseLoc, lhsLocation, instLocation, propertyIndex);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    this->m_writer.Property(Js::OpCode::DeleteFld_ReuseLoc, lhsLocation, instLocation, propertyIndex);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }
}